

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_UnknownArgument_Test::TestBody(ClCommandLine_UnknownArgument_Test *this)

{
  bool bVar1;
  char *pcVar2;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher;
  char *in_R9;
  AssertHelper local_450;
  Message local_448;
  uint local_43c;
  string local_438 [32];
  unsigned_long local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_1;
  Message local_3f8;
  string local_3f0 [32];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar;
  AssertHelper local_360;
  Message local_358;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_;
  string_stream errors;
  ostringstream local_1c0 [8];
  string_stream output;
  allocator local_31;
  string local_30;
  ClCommandLine_UnknownArgument_Test *local_10;
  ClCommandLine_UnknownArgument_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"progname",&local_31);
  (anonymous_namespace)::ClCommandLine::add<char_const*>((ClCommandLine *)this,&local_30,"--arg");
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&gtest_ar_.message_);
  bVar1 = anon_unknown.dwarf_19dfa::ClCommandLine::parse_command_line_options
                    (&this->super_ClCommandLine,(string_stream *)local_1c0,
                     (string_stream *)&gtest_ar_.message_);
  local_349 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_348,&local_349,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_348,
               (AssertionResult *)"this->parse_command_line_options (output, errors)","true","false"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  testing::HasSubstr<char[30]>(&local_3d0,(StringLike<char[30]> *)"Unknown command line argument");
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
            (&local_3b0,(internal *)&local_3d0,matcher);
  std::__cxx11::ostringstream::str();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_390,(char *)&local_3b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"errors.str ()")
  ;
  std::__cxx11::string::~string(local_3f0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_3b0);
  testing::
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~PolymorphicMatcher(&local_3d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xc5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  std::__cxx11::ostringstream::str();
  local_418 = std::__cxx11::string::length();
  local_43c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_410,"output.str ().length ()","0U",&local_418,&local_43c);
  std::__cxx11::string::~string(local_438);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_448);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              (&local_450,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_command_line.cpp"
               ,0xc6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_450,&local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_450);
    testing::Message::~Message(&local_448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&gtest_ar_.message_);
  std::__cxx11::ostringstream::~ostringstream(local_1c0);
  return;
}

Assistant:

TEST_F (ClCommandLine, UnknownArgument) {
    this->add ("progname", "--arg");

    string_stream output;
    string_stream errors;
    EXPECT_FALSE (this->parse_command_line_options (output, errors));
    EXPECT_THAT (errors.str (),
                 testing::HasSubstr (PSTORE_NATIVE_TEXT ("Unknown command line argument")));
    EXPECT_EQ (output.str ().length (), 0U);
}